

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Switch * __thiscall
wasm::Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
          (Builder *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *list,Name default_,
          Expression *condition,Expression *value)

{
  Switch *pSVar1;
  MixedArena *this_00;
  
  this_00 = &this->wasm->allocator;
  pSVar1 = (Switch *)MixedArena::allocSpace(this_00,0x50,8);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression._id = SwitchId;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression.type.id = 0;
  (pSVar1->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (pSVar1->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (pSVar1->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements = 0
  ;
  (pSVar1->targets).allocator = this_00;
  (pSVar1->default_).super_IString.str._M_len = 0;
  (pSVar1->default_).super_IString.str._M_str = (char *)0x0;
  pSVar1->value = (Expression *)0x0;
  pSVar1->condition = (Expression *)0x0;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression.type.id = 1;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&pSVar1->targets,list);
  (pSVar1->default_).super_IString.str._M_len = default_.super_IString.str._M_len;
  (pSVar1->default_).super_IString.str._M_str = default_.super_IString.str._M_str;
  pSVar1->value = value;
  pSVar1->condition = condition;
  return pSVar1;
}

Assistant:

Switch* makeSwitch(T& list,
                     Name default_,
                     Expression* condition,
                     Expression* value = nullptr) {
    auto* ret = wasm.allocator.alloc<Switch>();
    ret->targets.set(list);
    ret->default_ = default_;
    ret->value = value;
    ret->condition = condition;
    return ret;
  }